

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Capturer::captureValue(Capturer *this,size_t index,string *value)

{
  pointer pMVar1;
  size_type sVar2;
  reference pvVar3;
  string *in_RDX;
  ulong in_RSI;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *in_RDI;
  
  sVar2 = clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size(in_RDI);
  if (in_RSI < sVar2) {
    pvVar3 = clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::operator[]
                       (in_RDI,in_RSI);
    std::__cxx11::string::operator+=((string *)&pvVar3->message,in_RDX);
    pMVar1 = in_RDI[1].super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pvVar3 = clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::operator[]
                       (in_RDI,in_RSI);
    (**(code **)((pMVar1->macroName).m_start + 0x30))(pMVar1,pvVar3);
    in_RDI[1].super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((long)&((in_RDI[1].
                            super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->macroName).m_start + 1);
    return;
  }
  __assert_fail("index < m_messages.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/libKriging[P]libKriging/dependencies/Catch2/single_include/catch2/catch.hpp"
                ,0x2e9e,"void Catch::Capturer::captureValue(size_t, const std::string &)");
}

Assistant:

void Capturer::captureValue( size_t index, std::string const& value ) {
        assert( index < m_messages.size() );
        m_messages[index].message += value;
        m_resultCapture.pushScopedMessage( m_messages[index] );
        m_captured++;
    }